

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack22_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x16;
  out[1] = (uVar1 >> 0x16) + base + (in[1] & 0xfff) * 0x400;
  uVar1 = in[1];
  out[2] = uVar1 >> 0xc;
  out[2] = (uVar1 >> 0xc) + base + (in[2] & 3) * 0x100000;
  out[3] = (in[2] >> 2 & 0x3fffff) + base;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[3] & 0x3fff) * 0x100;
  uVar1 = in[3];
  out[5] = uVar1 >> 0xe;
  out[5] = (uVar1 >> 0xe) + base + (in[4] & 0xf) * 0x40000;
  out[6] = (in[4] >> 4 & 0x3fffff) + base;
  uVar1 = in[4];
  out[7] = uVar1 >> 0x1a;
  out[7] = (uVar1 >> 0x1a) + base + (in[5] & 0xffff) * 0x40;
  return in + 6;
}

Assistant:

uint32_t * unpack22_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 22 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 22 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 22 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 22 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 22 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 22 - 16 );
    *out += base;
    out++;

    return in + 1;
}